

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O1

xmlXPathObjectPtr xmlXPtrEval(xmlChar *str,xmlXPathContextPtr ctx)

{
  byte bVar1;
  xmlXPathContextPtr pxVar2;
  xmlChar *pxVar3;
  xmlNodeSetPtr pxVar4;
  xmlXPathParserContextPtr ctxt;
  xmlXPathObjectPtr *ppxVar5;
  xmlChar *str1;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  xmlXPathObjectPtr pxVar8;
  xmlXPathObjectPtr obj;
  ulong uVar9;
  byte *ns_uri;
  int iVar10;
  xmlChar *pxVar11;
  byte *pbVar12;
  
  xmlInitParser();
  if ((str == (xmlChar *)0x0 || ctx == (xmlXPathContextPtr)0x0) ||
     (ctxt = xmlXPathNewParserContext(str,ctx), ctxt == (xmlXPathParserContextPtr)0x0)) {
    return (xmlXPathObjectPtr)0x0;
  }
  if (ctxt->valueTab == (xmlXPathObjectPtr *)0x0) {
    ppxVar5 = (xmlXPathObjectPtr *)(*xmlMalloc)(0x50);
    ctxt->valueTab = ppxVar5;
    if (ppxVar5 == (xmlXPathObjectPtr *)0x0) {
      xmlXPtrErrMemory("allocating evaluation context");
      goto LAB_001e72ce;
    }
    ctxt->valueNr = 0;
    ctxt->valueMax = 10;
    ctxt->value = (xmlXPathObjectPtr)0x0;
    ctxt->valueFrame = 0;
  }
  pbVar12 = ctxt->cur;
  while( true ) {
    uVar9 = (ulong)*pbVar12;
    if (0x2f < uVar9) break;
    if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
      if (uVar9 == 0x2f) {
        xmlXPathRoot(ctxt);
        str1 = (xmlChar *)0x0;
        goto LAB_001e729c;
      }
      break;
    }
    ctxt->cur = pbVar12 + 1;
    pbVar12 = pbVar12 + 1;
  }
  str1 = xmlXPathParseName(ctxt);
  if (str1 != (xmlChar *)0x0) {
    if (*ctxt->cur == '(') {
LAB_001e6ed5:
      ctxt->error = 0;
      if (*ctxt->cur != '(') goto LAB_001e7166;
      pxVar11 = ctxt->cur + 1;
      ctxt->cur = pxVar11;
      iVar10 = xmlStrlen(pxVar11);
      pxVar11 = (xmlChar *)(*xmlMallocAtomic)((long)(iVar10 + 1));
      if (pxVar11 != (xmlChar *)0x0) {
        iVar10 = 1;
        pxVar6 = pxVar11;
LAB_001e6f0e:
        pbVar12 = ctxt->cur;
        bVar1 = *pbVar12;
        if (bVar1 < 0x29) {
          if (bVar1 == 0x28) {
            iVar10 = iVar10 + 1;
          }
          else if (bVar1 == 0) {
            *pxVar6 = '\0';
            if ((iVar10 == 0) || (*ctxt->cur != '\0')) goto LAB_001e6fc9;
            (*xmlFree)(str1);
            (*xmlFree)(pxVar11);
            goto LAB_001e6fb3;
          }
        }
        else if (bVar1 == 0x5e) {
          if ((pbVar12[1] - 0x28 < 0x37) &&
             ((0x40000000000003U >> ((ulong)(pbVar12[1] - 0x28) & 0x3f) & 1) != 0)) {
            ctxt->cur = pbVar12 + 1;
          }
        }
        else if ((bVar1 == 0x29) && (iVar10 = iVar10 + -1, iVar10 == 0)) goto LAB_001e6fc0;
        *pxVar6 = *ctxt->cur;
        pxVar6 = pxVar6 + 1;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
        goto LAB_001e6f0e;
      }
      xmlXPtrErrMemory("allocating buffer");
      goto LAB_001e7038;
    }
LAB_001e729c:
    xmlXPtrEvalChildSeq(ctxt,str1);
    pbVar12 = ctxt->cur;
    while( true ) {
      uVar9 = (ulong)*pbVar12;
      if (0x20 < uVar9) break;
      if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
        if (uVar9 == 0) goto LAB_001e72ce;
        break;
      }
      ctxt->cur = pbVar12 + 1;
      pbVar12 = pbVar12 + 1;
    }
  }
  xmlXPathErr(ctxt,7);
LAB_001e72ce:
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type == XPATH_NODESET)) {
    pxVar8 = valuePop(ctxt);
  }
  else {
    pxVar8 = (xmlXPathObjectPtr)0x0;
    xmlXPtrErr(ctxt,0x76e,"xmlXPtrEval: evaluation failed to return a node set\n",(xmlChar *)0x0);
  }
  iVar10 = 0;
  do {
    obj = valuePop(ctxt);
    if (obj != (xmlXPathObjectPtr)0x0) {
      if ((((obj->type != XPATH_NODESET) || (pxVar4 = obj->nodesetval, pxVar4 == (xmlNodeSetPtr)0x0)
           ) || (pxVar4->nodeNr != 1)) || ((xmlDocPtr)*pxVar4->nodeTab != ctx->doc)) {
        iVar10 = iVar10 + 1;
      }
      xmlXPathFreeObject(obj);
    }
  } while (obj != (xmlXPathObjectPtr)0x0);
  if (iVar10 != 0) {
    xmlXPtrErr(ctxt,0x76f,"xmlXPtrEval: object(s) left on the eval stack\n",(xmlChar *)0x0);
  }
  if (ctxt->error != 0) {
    xmlXPathFreeObject(pxVar8);
    pxVar8 = (xmlXPathObjectPtr)0x0;
  }
  xmlXPathFreeParserContext(ctxt);
  return pxVar8;
LAB_001e6fc0:
  ctxt->cur = pbVar12 + 1;
  *pxVar6 = '\0';
LAB_001e6fc9:
  iVar10 = xmlStrEqual(str1,(xmlChar *)"xpointer");
  if ((iVar10 == 0) && (iVar10 = xmlStrEqual(str1,(xmlChar *)"xpath1"), iVar10 == 0)) {
    iVar10 = xmlStrEqual(str1,"element");
    if (iVar10 == 0) {
      iVar10 = xmlStrEqual(str1,"xmlns");
      if (iVar10 != 0) {
        pxVar6 = ctxt->cur;
        pxVar3 = ctxt->base;
        ctxt->base = pxVar11;
        ctxt->cur = pxVar11;
        pxVar7 = xmlXPathParseNCName(ctxt);
        if (pxVar7 == (xmlChar *)0x0) {
          ctxt->base = pxVar3;
          ctxt->cur = pxVar6;
        }
        else {
          pbVar12 = ctxt->cur;
          ns_uri = pbVar12;
          while( true ) {
            ns_uri = ns_uri + 1;
            uVar9 = (ulong)*pbVar12;
            if (0x3d < uVar9) break;
            if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
              if (uVar9 == 0x3d) goto LAB_001e71fc;
              break;
            }
            pbVar12 = pbVar12 + 1;
            ctxt->cur = pbVar12;
          }
          ctxt->base = pxVar3;
          ctxt->cur = pxVar6;
          (*xmlFree)(pxVar7);
        }
        (*xmlFree)(pxVar11);
        (*xmlFree)(str1);
LAB_001e6fb3:
        iVar10 = 0x10;
LAB_001e7175:
        xmlXPathErr(ctxt,iVar10);
        goto LAB_001e717a;
      }
      xmlXPtrErr(ctxt,0x76c,"unsupported scheme \'%s\'\n",str1);
    }
    else {
      pxVar6 = ctxt->cur;
      pxVar3 = ctxt->base;
      ctxt->base = pxVar11;
      ctxt->cur = pxVar11;
      if (*pxVar11 == '/') {
        xmlXPathRoot(ctxt);
        pxVar7 = (xmlChar *)0x0;
      }
      else {
        pxVar7 = xmlXPathParseName(ctxt);
        if (pxVar7 == (xmlChar *)0x0) {
          ctxt->base = pxVar3;
          ctxt->cur = pxVar6;
          (*xmlFree)(pxVar11);
LAB_001e7166:
          (*xmlFree)(str1);
          iVar10 = 7;
          goto LAB_001e7175;
        }
      }
      xmlXPtrEvalChildSeq(ctxt,pxVar7);
      ctxt->base = pxVar3;
      ctxt->cur = pxVar6;
    }
  }
  else {
    pxVar6 = ctxt->cur;
    pxVar3 = ctxt->base;
    ctxt->base = pxVar11;
    ctxt->cur = pxVar11;
    pxVar2 = ctxt->context;
    pxVar2->node = (xmlNodePtr)pxVar2->doc;
    pxVar2->contextSize = 1;
    pxVar2->proximityPosition = 1;
    xmlXPathEvalExpr(ctxt);
    ctxt->cur = pxVar6;
    ctxt->base = pxVar3;
  }
LAB_001e7027:
  (*xmlFree)(pxVar11);
LAB_001e7038:
  (*xmlFree)(str1);
LAB_001e717a:
  if ((ctxt->error != 0x76c) && (ctxt->error != 0)) goto LAB_001e72ce;
  pxVar8 = ctxt->value;
  if (pxVar8 != (xmlXPathObjectPtr)0x0) {
    if (((pxVar8->type == XPATH_NODESET) && (pxVar8->nodesetval != (xmlNodeSetPtr)0x0)) &&
       (0 < pxVar8->nodesetval->nodeNr)) goto LAB_001e72ce;
    while (pxVar8 = valuePop(ctxt), pxVar8 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject(pxVar8);
    }
  }
  pbVar12 = ctxt->cur;
  while( true ) {
    if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar12 + 1;
    pbVar12 = pbVar12 + 1;
  }
  str1 = xmlXPathParseName(ctxt);
  if (str1 == (xmlChar *)0x0) goto LAB_001e72ce;
  goto LAB_001e6ed5;
LAB_001e71fc:
  while( true ) {
    ctxt->cur = ns_uri;
    if ((0x20 < (ulong)*ns_uri) || ((0x100002600U >> ((ulong)*ns_uri & 0x3f) & 1) == 0)) break;
    ns_uri = ns_uri + 1;
  }
  xmlXPathRegisterNs(ctxt->context,pxVar7,ns_uri);
  ctxt->base = pxVar3;
  ctxt->cur = pxVar6;
  (*xmlFree)(pxVar7);
  goto LAB_001e7027;
}

Assistant:

xmlXPathObjectPtr
xmlXPtrEval(const xmlChar *str, xmlXPathContextPtr ctx) {
    xmlXPathParserContextPtr ctxt;
    xmlXPathObjectPtr res = NULL, tmp;
    xmlXPathObjectPtr init = NULL;
    int stack = 0;

    xmlInitParser();

    if ((ctx == NULL) || (str == NULL))
	return(NULL);

    ctxt = xmlXPathNewParserContext(str, ctx);
    if (ctxt == NULL)
	return(NULL);
    xmlXPtrEvalXPointer(ctxt);

    if ((ctxt->value != NULL) &&
#ifdef LIBXML_XPTR_LOCS_ENABLED
	(ctxt->value->type != XPATH_LOCATIONSET) &&
#endif
	(ctxt->value->type != XPATH_NODESET)) {
        xmlXPtrErr(ctxt, XML_XPTR_EVAL_FAILED,
		"xmlXPtrEval: evaluation failed to return a node set\n",
		   NULL);
    } else {
	res = valuePop(ctxt);
    }

    do {
        tmp = valuePop(ctxt);
	if (tmp != NULL) {
	    if (tmp != init) {
		if (tmp->type == XPATH_NODESET) {
		    /*
		     * Evaluation may push a root nodeset which is unused
		     */
		    xmlNodeSetPtr set;
		    set = tmp->nodesetval;
		    if ((set == NULL) || (set->nodeNr != 1) ||
			(set->nodeTab[0] != (xmlNodePtr) ctx->doc))
			stack++;
		} else
		    stack++;
	    }
	    xmlXPathFreeObject(tmp);
        }
    } while (tmp != NULL);
    if (stack != 0) {
        xmlXPtrErr(ctxt, XML_XPTR_EXTRA_OBJECTS,
		   "xmlXPtrEval: object(s) left on the eval stack\n",
		   NULL);
    }
    if (ctxt->error != XPATH_EXPRESSION_OK) {
	xmlXPathFreeObject(res);
	res = NULL;
    }

    xmlXPathFreeParserContext(ctxt);
    return(res);
}